

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_cfg.cpp
# Opt level: O0

spv_result_t
spvtools::val::StructuredSwitchChecks
          (ValidationState_t *_,Function *function,Instruction *switch_inst,BasicBlock *header,
          BasicBlock *merge)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  uint32_t uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_> *pvVar8;
  size_type sVar9;
  Instruction *pIVar10;
  pointer ppVar11;
  pointer ppVar12;
  DiagnosticStream *pDVar13;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar14;
  pair<spvtools::val::BasicBlock_*,_bool> pVar15;
  __enable_if_t<is_constructible<value_type,_pair<unsigned_int,_unsigned_int>_&&>::value,_pair<iterator,_bool>_>
  _Var16;
  string local_7e8;
  DiagnosticStream local_7c8;
  reference local_5f0;
  pair<const_unsigned_int,_unsigned_int> *pair;
  iterator __end2;
  iterator __begin2;
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *__range2;
  string local_5b0;
  DiagnosticStream local_590;
  uint32_t local_3b8;
  undefined1 local_3b1;
  uint32_t j;
  bool is_default;
  undefined1 local_3a8;
  pair<unsigned_int,_unsigned_int> local_3a0;
  _Base_ptr local_398;
  int local_38c;
  pair<unsigned_int,_int> local_388;
  const_iterator local_380;
  _Self local_378;
  _Self local_370;
  iterator where;
  spv_result_t error;
  string local_340;
  DiagnosticStream local_320;
  BasicBlock *local_148;
  undefined1 local_140;
  BasicBlock *local_138;
  undefined1 local_130;
  BasicBlock *local_128;
  BasicBlock *target_block;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_118;
  iterator seen_iter;
  uint local_108;
  uint32_t case_fall_through;
  uint32_t target_1;
  uint32_t i_2;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  seen_to_fall_through;
  uint32_t i_1;
  uint uStack_bc;
  bool default_appears_multiple_times;
  uint32_t default_target;
  uint32_t default_case_fall_through;
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  num_fall_through_targeted;
  uint local_78;
  uint local_74;
  uint32_t target;
  uint32_t i;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  case_targets;
  BasicBlock *merge_local;
  BasicBlock *header_local;
  Instruction *switch_inst_local;
  Function *function_local;
  ValidationState_t *__local;
  
  case_targets._M_h._M_single_bucket = (__node_base_ptr)merge;
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&target);
  local_74 = 1;
  while( true ) {
    uVar7 = (ulong)local_74;
    pvVar8 = Instruction::operands(switch_inst);
    sVar9 = std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::size(pvVar8);
    if (sVar9 <= uVar7) break;
    uVar3 = Instruction::GetOperandAs<unsigned_int>(switch_inst,(ulong)local_74);
    local_78 = uVar3;
    uVar4 = BasicBlock::id((BasicBlock *)case_targets._M_h._M_single_bucket);
    if (uVar3 != uVar4) {
      pVar14 = std::
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               ::insert((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                         *)&target,&local_78);
      num_fall_through_targeted._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (size_t)pVar14.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
    }
    local_74 = local_74 + 2;
  }
  std::
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::map((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
         *)&default_target);
  uStack_bc = 0;
  uVar3 = Instruction::GetOperandAs<unsigned_int>(switch_inst,1);
  seen_to_fall_through._M_h._M_single_bucket._7_1_ = 0;
  seen_to_fall_through._M_h._M_single_bucket._0_4_ = 3;
  while( true ) {
    uVar7 = (ulong)(uint)seen_to_fall_through._M_h._M_single_bucket;
    pvVar8 = Instruction::operands(switch_inst);
    sVar9 = std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::size(pvVar8);
    if (sVar9 <= uVar7) break;
    uVar5 = Instruction::GetOperandAs<unsigned_int>
                      (switch_inst,(ulong)(uint)seen_to_fall_through._M_h._M_single_bucket);
    if (uVar3 == uVar5) {
      seen_to_fall_through._M_h._M_single_bucket._7_1_ = 1;
      break;
    }
    seen_to_fall_through._M_h._M_single_bucket._0_4_ =
         (uint)seen_to_fall_through._M_h._M_single_bucket + 2;
  }
  std::
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::unordered_map((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                   *)&target_1);
  case_fall_through = 1;
  while( true ) {
    uVar7 = (ulong)case_fall_through;
    pvVar8 = Instruction::operands(switch_inst);
    sVar9 = std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::size(pvVar8);
    if (sVar9 <= uVar7) break;
    uVar5 = Instruction::GetOperandAs<unsigned_int>(switch_inst,(ulong)case_fall_through);
    local_108 = uVar5;
    uVar4 = BasicBlock::id((BasicBlock *)case_targets._M_h._M_single_bucket);
    if (uVar5 != uVar4) {
      seen_iter.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur
      ._4_4_ = 0;
      local_118._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::find((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                   *)&target_1,&local_108);
      target_block = (BasicBlock *)
                     std::
                     unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                     ::end((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                            *)&target_1);
      bVar1 = std::__detail::operator==
                        (&local_118,
                         (_Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> *)
                         &target_block);
      if (bVar1) {
        pVar15 = Function::GetBlock(function,local_108);
        local_148 = pVar15.first;
        local_140 = pVar15.second;
        local_138 = local_148;
        local_130 = local_140;
        local_128 = local_148;
        bVar1 = BasicBlock::structurally_reachable(header);
        if (((bVar1) && (bVar1 = BasicBlock::structurally_reachable(local_128), bVar1)) &&
           (bVar1 = BasicBlock::structurally_dominates(header,local_128), !bVar1)) {
          pIVar10 = BasicBlock::label(header);
          ValidationState_t::diag(&local_320,_,SPV_ERROR_INVALID_CFG,pIVar10);
          pDVar13 = DiagnosticStream::operator<<(&local_320,(char (*) [15])"Switch header ");
          uVar4 = BasicBlock::id(header);
          ValidationState_t::getIdName_abi_cxx11_(&local_340,_,uVar4);
          pDVar13 = DiagnosticStream::operator<<(pDVar13,&local_340);
          pDVar13 = DiagnosticStream::operator<<
                              (pDVar13,(char (*) [52])
                                       " does not structurally dominate its case construct ");
          ValidationState_t::getIdName_abi_cxx11_((string *)&error,_,local_108);
          pDVar13 = DiagnosticStream::operator<<
                              (pDVar13,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&error);
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar13);
          std::__cxx11::string::~string((string *)&error);
          std::__cxx11::string::~string((string *)&local_340);
          DiagnosticStream::~DiagnosticStream(&local_320);
          goto LAB_00263424;
        }
        where._M_node._0_4_ =
             FindCaseFallThrough(_,local_128,
                                 (uint32_t *)
                                 ((long)&seen_iter.
                                         super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                         ._M_cur + 4),
                                 (BasicBlock *)case_targets._M_h._M_single_bucket,
                                 (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                                  *)&target,function);
        __local._4_4_ = (spv_result_t)where._M_node;
        if ((spv_result_t)where._M_node != SPV_SUCCESS) goto LAB_00263424;
        if (seen_iter.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
            _M_cur._4_4_ != 0) {
          local_370._M_node =
               (_Base_ptr)
               std::
               map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::lower_bound((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                              *)&default_target,
                             (key_type_conflict *)
                             ((long)&seen_iter.
                                     super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                     ._M_cur + 4));
          local_378._M_node =
               (_Base_ptr)
               std::
               map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::end((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                      *)&default_target);
          bVar2 = std::operator==(&local_370,&local_378);
          bVar1 = true;
          if (!bVar2) {
            ppVar11 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>::
                      operator->(&local_370);
            bVar1 = ppVar11->first !=
                    seen_iter.
                    super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                    _M_cur._4_4_;
          }
          if (bVar1) {
            std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_unsigned_int>_>::
            _Rb_tree_const_iterator(&local_380,&local_370);
            local_38c = 1;
            local_388 = std::make_pair<unsigned_int&,int>
                                  ((uint *)((long)&seen_iter.
                                                                                                      
                                                  super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                                  ._M_cur + 4),&local_38c);
            local_398 = (_Base_ptr)
                        std::
                        map<unsigned_int,unsigned_int,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                        ::insert<std::pair<unsigned_int,int>>
                                  ((map<unsigned_int,unsigned_int,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                                    *)&default_target,local_380,&local_388);
          }
          else {
            ppVar11 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>::
                      operator->(&local_370);
            ppVar11->second = ppVar11->second + 1;
          }
        }
        local_3a0 = std::make_pair<unsigned_int&,unsigned_int&>
                              (&local_108,
                               (uint *)((long)&seen_iter.
                                               super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                               ._M_cur + 4));
        _Var16 = std::
                 unordered_map<unsigned_int,unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                 ::insert<std::pair<unsigned_int,unsigned_int>>
                           ((unordered_map<unsigned_int,unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                             *)&target_1,&local_3a0);
        _j = (__node_type *)
             _Var16.first.
             super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur;
        local_3a8 = _Var16.second;
      }
      else {
        ppVar12 = std::__detail::
                  _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::
                  operator->((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>
                              *)&local_118);
        seen_iter.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
        _M_cur._4_4_ = ppVar12->second;
      }
      if ((seen_iter.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
           _M_cur._4_4_ == uVar3) && ((seen_to_fall_through._M_h._M_single_bucket._7_1_ & 1) == 0))
      {
        seen_iter.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
        _M_cur._4_4_ = uStack_bc;
      }
      if (seen_iter.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
          _M_cur._4_4_ != 0) {
        local_3b1 = case_fall_through == 1;
        if ((bool)local_3b1) {
          uStack_bc = seen_iter.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                      _M_cur._4_4_;
        }
        else {
          local_3b8 = case_fall_through;
          while( true ) {
            uVar6 = local_3b8 + 2;
            pvVar8 = Instruction::operands(switch_inst);
            sVar9 = std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::size
                              (pvVar8);
            uVar5 = local_108;
            bVar1 = false;
            if (uVar6 < sVar9) {
              uVar6 = Instruction::GetOperandAs<unsigned_int>(switch_inst,(ulong)(local_3b8 + 2));
              bVar1 = uVar5 == uVar6;
            }
            if (!bVar1) break;
            local_3b8 = local_3b8 + 2;
          }
          pvVar8 = Instruction::operands(switch_inst);
          sVar9 = std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::size
                            (pvVar8);
          uVar5 = seen_iter.
                  super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                  _M_cur._4_4_;
          if ((sVar9 < local_3b8 + 2) ||
             (uVar6 = Instruction::GetOperandAs<unsigned_int>(switch_inst,(ulong)(local_3b8 + 2)),
             uVar5 != uVar6)) {
            ValidationState_t::diag(&local_590,_,SPV_ERROR_INVALID_CFG,switch_inst);
            pDVar13 = DiagnosticStream::operator<<
                                (&local_590,(char (*) [29])"Case construct that targets ");
            ValidationState_t::getIdName_abi_cxx11_(&local_5b0,_,local_108);
            pDVar13 = DiagnosticStream::operator<<(pDVar13,&local_5b0);
            pDVar13 = DiagnosticStream::operator<<
                                (pDVar13,(char (*) [50])
                                         " has branches to the case construct that targets ");
            ValidationState_t::getIdName_abi_cxx11_
                      ((string *)&__range2,_,
                       seen_iter.
                       super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                       ._M_cur._4_4_);
            pDVar13 = DiagnosticStream::operator<<
                                (pDVar13,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&__range2);
            pDVar13 = DiagnosticStream::operator<<
                                (pDVar13,(char (*) [68])
                                         ", but does not immediately precede it in the OpSwitch\'s target list"
                                );
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar13);
            std::__cxx11::string::~string((string *)&__range2);
            std::__cxx11::string::~string((string *)&local_5b0);
            DiagnosticStream::~DiagnosticStream(&local_590);
            goto LAB_00263424;
          }
        }
      }
    }
    case_fall_through = case_fall_through + 2;
  }
  __end2 = std::
           map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::begin((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                    *)&default_target);
  pair = (pair<const_unsigned_int,_unsigned_int> *)
         std::
         map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
         ::end((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                *)&default_target);
  do {
    bVar1 = std::operator!=(&__end2,(_Self *)&pair);
    if (!bVar1) {
      __local._4_4_ = SPV_SUCCESS;
LAB_00263424:
      where._M_node._4_4_ = 1;
      std::
      unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
      ::~unordered_map((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                        *)&target_1);
      std::
      map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
      ::~map((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
              *)&default_target);
      std::
      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                        *)&target);
      return __local._4_4_;
    }
    local_5f0 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>::operator*
                          (&__end2);
    if (1 < local_5f0->second) {
      pIVar10 = ValidationState_t::FindDef(_,local_5f0->first);
      ValidationState_t::diag(&local_7c8,_,SPV_ERROR_INVALID_CFG,pIVar10);
      pDVar13 = DiagnosticStream::operator<<
                          (&local_7c8,
                           (char (*) [75])
                           "Multiple case constructs have branches to the case construct that targets "
                          );
      ValidationState_t::getIdName_abi_cxx11_(&local_7e8,_,local_5f0->first);
      pDVar13 = DiagnosticStream::operator<<(pDVar13,&local_7e8);
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar13);
      std::__cxx11::string::~string((string *)&local_7e8);
      DiagnosticStream::~DiagnosticStream(&local_7c8);
      goto LAB_00263424;
    }
    std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>::operator++(&__end2);
  } while( true );
}

Assistant:

spv_result_t StructuredSwitchChecks(ValidationState_t& _, Function* function,
                                    const Instruction* switch_inst,
                                    const BasicBlock* header,
                                    const BasicBlock* merge) {
  std::unordered_set<uint32_t> case_targets;
  for (uint32_t i = 1; i < switch_inst->operands().size(); i += 2) {
    uint32_t target = switch_inst->GetOperandAs<uint32_t>(i);
    if (target != merge->id()) case_targets.insert(target);
  }
  // Tracks how many times each case construct is targeted by another case
  // construct.
  std::map<uint32_t, uint32_t> num_fall_through_targeted;
  uint32_t default_case_fall_through = 0u;
  uint32_t default_target = switch_inst->GetOperandAs<uint32_t>(1u);
  bool default_appears_multiple_times = false;
  for (uint32_t i = 3; i < switch_inst->operands().size(); i += 2) {
    if (default_target == switch_inst->GetOperandAs<uint32_t>(i)) {
      default_appears_multiple_times = true;
      break;
    }
  }
  std::unordered_map<uint32_t, uint32_t> seen_to_fall_through;
  for (uint32_t i = 1; i < switch_inst->operands().size(); i += 2) {
    uint32_t target = switch_inst->GetOperandAs<uint32_t>(i);
    if (target == merge->id()) continue;

    uint32_t case_fall_through = 0u;
    auto seen_iter = seen_to_fall_through.find(target);
    if (seen_iter == seen_to_fall_through.end()) {
      const auto target_block = function->GetBlock(target).first;
      // OpSwitch must dominate all its case constructs.
      if (header->structurally_reachable() &&
          target_block->structurally_reachable() &&
          !header->structurally_dominates(*target_block)) {
        return _.diag(SPV_ERROR_INVALID_CFG, header->label())
               << "Switch header " << _.getIdName(header->id())
               << " does not structurally dominate its case construct "
               << _.getIdName(target);
      }

      if (auto error = FindCaseFallThrough(_, target_block, &case_fall_through,
                                           merge, case_targets, function)) {
        return error;
      }

      // Track how many time the fall through case has been targeted.
      if (case_fall_through != 0u) {
        auto where = num_fall_through_targeted.lower_bound(case_fall_through);
        if (where == num_fall_through_targeted.end() ||
            where->first != case_fall_through) {
          num_fall_through_targeted.insert(
              where, std::make_pair(case_fall_through, 1));
        } else {
          where->second++;
        }
      }
      seen_to_fall_through.insert(std::make_pair(target, case_fall_through));
    } else {
      case_fall_through = seen_iter->second;
    }

    if (case_fall_through == default_target &&
        !default_appears_multiple_times) {
      case_fall_through = default_case_fall_through;
    }
    if (case_fall_through != 0u) {
      bool is_default = i == 1;
      if (is_default) {
        default_case_fall_through = case_fall_through;
      } else {
        // Allow code like:
        // case x:
        // case y:
        //   ...
        // case z:
        //
        // Where x and y target the same block and fall through to z.
        uint32_t j = i;
        while ((j + 2 < switch_inst->operands().size()) &&
               target == switch_inst->GetOperandAs<uint32_t>(j + 2)) {
          j += 2;
        }
        // If Target T1 branches to Target T2, or if Target T1 branches to the
        // Default target and the Default target branches to Target T2, then T1
        // must immediately precede T2 in the list of OpSwitch Target operands.
        if ((switch_inst->operands().size() < j + 2) ||
            (case_fall_through != switch_inst->GetOperandAs<uint32_t>(j + 2))) {
          return _.diag(SPV_ERROR_INVALID_CFG, switch_inst)
                 << "Case construct that targets " << _.getIdName(target)
                 << " has branches to the case construct that targets "
                 << _.getIdName(case_fall_through)
                 << ", but does not immediately precede it in the "
                    "OpSwitch's target list";
        }
      }
    }
  }

  // Each case construct must be branched to by at most one other case
  // construct.
  for (const auto& pair : num_fall_through_targeted) {
    if (pair.second > 1) {
      return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef(pair.first))
             << "Multiple case constructs have branches to the case construct "
                "that targets "
             << _.getIdName(pair.first);
    }
  }

  return SPV_SUCCESS;
}